

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GofRAngle.hpp
# Opt level: O2

void __thiscall
OpenMD::GofRTheta::GofRTheta
          (GofRTheta *this,SimInfo *info,string *filename,string *sele1,string *sele2,string *sele3,
          RealType len,int nrbins,int nangleBins)

{
  string local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  GofRAngle::GofRAngle(&this->super_GofRAngle,info,filename,sele1,sele2,sele3,len,nrbins,nangleBins)
  ;
  (this->super_GofRAngle).super_RadialDistrFunc.super_StaticAnalyser._vptr_StaticAnalyser =
       (_func_int **)&PTR__GofRAngle_002ed0f8;
  getPrefix(&local_50,filename);
  std::operator+(&local_30,&local_50,".gofrt");
  std::__cxx11::string::_M_assign
            ((string *)
             &(this->super_GofRAngle).super_RadialDistrFunc.super_StaticAnalyser.outputFilename_);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

GofRTheta(SimInfo* info, const std::string& filename,
              const std::string& sele1, const std::string& sele2,
              const std::string& sele3, RealType len, int nrbins,
              int nangleBins) :
        GofRAngle(info, filename, sele1, sele2, sele3, len, nrbins,
                  nangleBins) {
      setOutputName(getPrefix(filename) + ".gofrt");
    }